

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O3

Aig_Obj_t * Aig_ManDupRepres_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  uint uVar5;
  Aig_Obj_t *p0;
  
  if ((Aig_Obj_t *)(pObj->field_5).pData != (Aig_Obj_t *)0x0) {
    return (Aig_Obj_t *)(pObj->field_5).pData;
  }
  if ((p->pReprs != (Aig_Obj_t **)0x0) && (pAVar3 = p->pReprs[pObj->Id], pAVar3 != (Aig_Obj_t *)0x0)
     ) {
    Aig_ManDupRepres_rec(pNew,p,pAVar3);
    pAVar3 = (Aig_Obj_t *)
             ((ulong)((*(uint *)&pObj->field_0x18 ^ *(uint *)&pAVar3->field_0x18) >> 3 & 1) ^
             (ulong)(pAVar3->field_5).pData);
    goto LAB_006c349d;
  }
  Aig_ManDupRepres_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
  Aig_ManDupRepres_rec(pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
  ppAVar1 = p->pReprs;
  uVar4 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
  uVar5 = (uint)pObj->pFanin0;
  if (ppAVar1 == (Aig_Obj_t **)0x0) {
    p0 = (Aig_Obj_t *)((ulong)(uVar5 & 1) ^ *(ulong *)(uVar4 + 0x28));
    pAVar3 = pObj->pFanin1;
    uVar4 = (ulong)pAVar3 & 0xfffffffffffffffe;
LAB_006c348b:
    uVar4 = *(ulong *)(uVar4 + 0x28);
  }
  else {
    pAVar3 = ppAVar1[*(int *)(uVar4 + 0x24)];
    if (pAVar3 == (Aig_Obj_t *)0x0) {
      p0 = (Aig_Obj_t *)((ulong)(uVar5 & 1) ^ *(ulong *)(uVar4 + 0x28));
    }
    else {
      p0 = (Aig_Obj_t *)
           ((ulong)(uVar5 & 1) ^ (ulong)(pAVar3->field_5).pData ^
           (ulong)((*(uint *)&pAVar3->field_0x18 ^ *(uint *)(uVar4 + 0x18)) >> 3 & 1));
    }
    pAVar3 = pObj->pFanin1;
    uVar4 = (ulong)pAVar3 & 0xfffffffffffffffe;
    pAVar2 = ppAVar1[*(int *)(uVar4 + 0x24)];
    if (pAVar2 == (Aig_Obj_t *)0x0) goto LAB_006c348b;
    uVar4 = (ulong)((*(uint *)&pAVar2->field_0x18 ^ *(uint *)(uVar4 + 0x18)) >> 3 & 1) ^
            (ulong)(pAVar2->field_5).pData;
  }
  pAVar3 = Aig_And(pNew,p0,(Aig_Obj_t *)((uint)pAVar3 & 1 ^ uVar4));
LAB_006c349d:
  (pObj->field_5).pData = pAVar3;
  return pAVar3;
}

Assistant:

Aig_Obj_t * Aig_ManDupRepres_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pRepr;
    if ( pObj->pData )
        return (Aig_Obj_t *)pObj->pData;
    if ( (pRepr = Aig_ObjRepr(p, pObj)) )
    {
        Aig_ManDupRepres_rec( pNew, p, pRepr );
        return (Aig_Obj_t *)(pObj->pData = Aig_NotCond( (Aig_Obj_t *)pRepr->pData, pRepr->fPhase ^ pObj->fPhase ));
    }
    Aig_ManDupRepres_rec( pNew, p, Aig_ObjFanin0(pObj) );
    Aig_ManDupRepres_rec( pNew, p, Aig_ObjFanin1(pObj) );
    return (Aig_Obj_t *)(pObj->pData = Aig_And( pNew, Aig_ObjChild0Repres(p, pObj), Aig_ObjChild1Repres(p, pObj) ));
}